

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::resume(QSslSocket *this)

{
  QSslSocketPrivate *pQVar1;
  undefined8 in_RDI;
  ConnectionType c;
  char *unaff_retaddr;
  QSslSocketPrivate *d;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QSslSocket *)0x3a050b);
  if ((pQVar1->paused & 1U) != 0) {
    QMetaObject::invokeMethod<>((QObject *)d,unaff_retaddr,c);
  }
  return;
}

Assistant:

void QSslSocket::resume()
{
    Q_D(QSslSocket);
    if (!d->paused)
        return;
    // continuing might emit signals, rather do this through the event loop
    QMetaObject::invokeMethod(this, "_q_resumeImplementation", Qt::QueuedConnection);
}